

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O2

void __thiscall
miniros::ServiceClientLink::onRequestLength
          (ServiceClientLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  uint __fd;
  undefined7 in_register_00000081;
  allocator<char> local_31;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if ((int)CONCAT71(in_register_00000081,success) != 0) {
    __fd = *(uint *)(buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (__fd < 0x3b9aca01) {
      local_30._8_8_ = 0;
      local_18 = std::
                 _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:227:7)>
                 ::_M_invoke;
      local_20 = std::
                 _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:227:7)>
                 ::_M_manager;
      local_30._M_unused._M_object = this;
      Connection::read((this->connection_).
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       __fd,&local_30,0x24509e);
      std::_Function_base::~_Function_base((_Function_base *)&local_30);
    }
    else {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (onRequestLength::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_30._M_pod_data,"miniros.service_client_link",&local_31);
        console::initializeLogLocation(&onRequestLength::loc,(string *)&local_30,Error);
        std::__cxx11::string::~string((string *)local_30._M_pod_data);
      }
      if (onRequestLength::loc.level_ != Error) {
        console::setLogLocationLevel(&onRequestLength::loc,Error);
        console::checkLogLocationEnabled(&onRequestLength::loc);
      }
      if (onRequestLength::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,onRequestLength::loc.logger_,onRequestLength::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp"
                       ,0xdd,
                       "void miniros::ServiceClientLink::onRequestLength(const ConnectionPtr &, const std::shared_ptr<uint8_t[]> &, uint32_t, bool)"
                       ,
                       "a message of over a gigabyte was predicted in tcpros. that seems highly unlikely, so I\'ll assume protocol synchronization is lost."
                      );
      }
      Connection::drop((conn->super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,Destructing);
    }
  }
  return;
}

Assistant:

void ServiceClientLink::onRequestLength(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)size;
  if (!success)
    return;

  MINIROS_ASSERT(conn == connection_);
  MINIROS_ASSERT(size == 4);

  uint32_t len = *((uint32_t*)buffer.get());

  if (len > 1000000000)
  {
    MINIROS_ERROR("a message of over a gigabyte was " \
                "predicted in tcpros. that seems highly " \
                "unlikely, so I'll assume protocol " \
                "synchronization is lost.");
    conn->drop(Connection::Destructing);
    return;
  }

  connection_->read(len,
      [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
      {
          this->onRequest(conn, buffer, size, success);
      });
}